

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O0

ChunkDrawable * __thiscall
FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::at
          (FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *this,unsigned_long *key
          )

{
  bool bVar1;
  out_of_range *this_00;
  pointer ppVar2;
  unsigned_long *unaff_retaddr;
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *in_stack_00000008;
  iterator val;
  vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (pair<unsigned_long,_ChunkDrawable> *)find(in_stack_00000008,unaff_retaddr);
  std::
  vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
  ::end(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffffc0,
                     (__normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                      *)in_stack_ffffffffffffffb8);
  if (!bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
             ::operator->(local_18);
    return &ppVar2->second;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"FlatMap::at");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

T& at(const Key& key) {
        auto val = find(key);
        if (val == vec_.end()) {
            throw std::out_of_range("FlatMap::at");
        }
        return val->second;
    }